

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O2

mpack_node_data_t * mpack_node_map_str_impl(mpack_node_t node,char *str,size_t length)

{
  uint uVar1;
  mpack_node_data_t *pmVar2;
  mpack_error_t error;
  int iVar3;
  mpack_tree_t *tree;
  mpack_node_data_t *pmVar4;
  long lVar5;
  mpack_node_data_t *local_40;
  
  tree = node.tree;
  pmVar4 = node.data;
  if (tree->error != mpack_ok) {
    return (mpack_node_data_t *)0x0;
  }
  if (pmVar4->type == mpack_type_map) {
    uVar1 = pmVar4->len;
    local_40 = (mpack_node_data_t *)0x0;
    for (lVar5 = 0; (ulong)uVar1 << 5 != lVar5; lVar5 = lVar5 + 0x20) {
      pmVar2 = (pmVar4->value).children;
      if (((*(int *)((long)&pmVar2->type + lVar5) == 7) &&
          (*(uint *)((long)&pmVar2->len + lVar5) == length)) &&
         (iVar3 = bcmp(str,tree->data + *(long *)((long)&pmVar2->value + lVar5),length), iVar3 == 0)
         ) {
        if (local_40 != (mpack_node_data_t *)0x0) {
          error = mpack_error_data;
          goto LAB_001082eb;
        }
        local_40 = (mpack_node_data_t *)((long)&pmVar2[1].type + lVar5);
      }
    }
  }
  else {
    error = mpack_error_type;
LAB_001082eb:
    mpack_tree_flag_error(tree,error);
    local_40 = (mpack_node_data_t *)0x0;
  }
  return local_40;
}

Assistant:

static mpack_node_data_t* mpack_node_map_str_impl(mpack_node_t node, const char* str, size_t length) {
    if (mpack_node_error(node) != mpack_ok)
        return NULL;

    mpack_assert(length == 0 || str != NULL, "str of length %i is NULL", (int)length);

    if (node.data->type != mpack_type_map) {
        mpack_node_flag_error(node, mpack_error_type);
        return NULL;
    }

    mpack_tree_t* tree = node.tree;
    mpack_node_data_t* found = NULL;

    for (size_t i = 0; i < node.data->len; ++i) {
        mpack_node_data_t* key = mpack_node_child(node, i * 2);

        if (key->type == mpack_type_str && key->len == length &&
                mpack_memcmp(str, mpack_node_data_unchecked(mpack_node(tree, key)), length) == 0) {
            if (found) {
                mpack_node_flag_error(node, mpack_error_data);
                return NULL;
            }
            found = mpack_node_child(node, i * 2 + 1);
        }
    }

    if (found)
        return found;

    return NULL;
}